

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbor_parser.hpp
# Opt level: O0

size_t __thiscall
jsoncons::cbor::basic_cbor_parser<jsoncons::stream_source<unsigned_char>,_std::allocator<char>_>::
get_size(basic_cbor_parser<jsoncons::stream_source<unsigned_char>,_std::allocator<char>_> *this,
        error_code *ec)

{
  bool bVar1;
  uint64_t uVar2;
  error_code *in_RSI;
  error_code *in_RDI;
  size_t len;
  uint64_t u;
  basic_cbor_parser<jsoncons::stream_source<unsigned_char>,_std::allocator<char>_>
  *in_stack_fffffffffffffff8;
  
  uVar2 = get_uint64_value(in_stack_fffffffffffffff8,in_RDI);
  bVar1 = std::error_code::operator_cast_to_bool(in_RSI);
  if (bVar1) {
    uVar2 = 0;
  }
  return uVar2;
}

Assistant:

std::size_t get_size(std::error_code& ec)
    {
        uint64_t u = get_uint64_value(ec);
        if (JSONCONS_UNLIKELY(ec))
        {
            return 0;
        }
        std::size_t len = static_cast<std::size_t>(u);
        if (len != u)
        {
            ec = cbor_errc::number_too_large;
            more_ = false;
        }
        return len;
    }